

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

string * __thiscall
runtime::VirtualMachine::variableToString_abi_cxx11_
          (string *__return_storage_ptr__,VirtualMachine *this,Variable var,bool panic)

{
  anon_union_8_6_52c89740_for_Variable_1 __val;
  char *__s;
  string local_40;
  allocator<char> local_19;
  
  __val = var.field_1;
  switch(var.type) {
  case Undefined:
    __s = "undefined";
    break;
  case Integer:
    std::__cxx11::to_string(__return_storage_ptr__,__val.integerValue);
    return __return_storage_ptr__;
  case Boolean:
    __s = "false";
    if (((undefined1  [16])var & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __s = "true";
    }
    break;
  case Float:
    std::__cxx11::to_string(__return_storage_ptr__,__val.doubleValue);
    return __return_storage_ptr__;
  case String:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__val.objectValue);
    return __return_storage_ptr__;
  case Object:
    __s = "<object>";
    break;
  case Function:
    __s = "<function>";
    break;
  default:
    if (panic) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unknown varible type at variableToString",&local_19);
      VirtualMachine::panic(this,&local_40);
    }
    __s = "UKNOWN!";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string VirtualMachine::variableToString(Variable var, bool panic) {
  switch (var.type) {
    case VariableType::Integer: {
      return std::to_string(var.integerValue);
    }
    case VariableType::Float: {
      return std::to_string(var.doubleValue);
    }
    case VariableType::Function: {
      return "<function>";
    }
    case VariableType::Object: {
      return "<object>";
    }
    case VariableType::String: {
      return *var.stringValue;
    }
    case VariableType::Undefined: {
      return "undefined";
    }
    case VariableType::Boolean: {
      return var.boolValue ? "true" : "false";
    }
    default: {
      if (panic) {
        this->panic("Unknown varible type at variableToString");
      } else {
        return "UKNOWN!";
      }
    }
  }
}